

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device_debug.cpp
# Opt level: O0

Vec3fa embree::renderPixelDebugShader
                 (DebugShaderData *data,float x,float y,ISPCCamera *camera,RayStats *stats,
                 RTCFeatureFlags feature_mask)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *in_RCX;
  float *in_RDX;
  undefined8 *in_RSI;
  embree *in_RDI;
  undefined4 in_R8D;
  float in_XMM0_Da;
  float fVar6;
  float fVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  float in_XMM1_Da;
  ulong extraout_XMM1_Qa;
  ulong extraout_XMM1_Qa_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  RTCGeometry geometry;
  uint geomID;
  Vec2f st;
  int64_t c1;
  RTCIntersectArguments args_1;
  RTCOccludedArguments args;
  int64_t c0;
  Ray ray;
  RTCInterpolateArguments args_2;
  __m128 mask;
  vfloat4 c_6;
  vfloat4 b_3;
  vfloat4 a_6;
  vfloat4 c_1;
  vfloat4 b;
  vfloat4 a_1;
  vfloat4 c_3;
  vfloat4 b_1;
  vfloat4 a_3;
  vfloat4 c_5;
  vfloat4 b_2;
  vfloat4 a_5;
  vfloat4 c_9;
  vfloat4 b_4;
  vfloat4 a_9;
  __m128 c_7;
  __m128 r_3;
  __m128 a_7;
  __m128 c;
  __m128 r;
  __m128 a;
  __m128 c_2;
  __m128 r_1;
  __m128 a_2;
  __m128 c_4;
  __m128 r_2;
  __m128 a_4;
  __m128 c_8;
  __m128 r_4;
  __m128 a_8;
  undefined8 local_2388 [7];
  undefined8 local_2350;
  uint local_2348;
  undefined4 local_2344;
  undefined4 local_2340;
  float local_233c;
  float local_2338;
  int64_t local_22b8;
  undefined4 local_22b0;
  undefined4 local_22ac;
  undefined8 local_22a8;
  undefined8 local_22a0;
  undefined8 local_2298;
  undefined4 local_2290;
  undefined4 local_228c;
  undefined8 local_2288;
  undefined8 local_2280;
  undefined8 local_2278;
  int64_t local_2270;
  float local_2264 [3];
  float local_2258 [3];
  float local_224c [3];
  float local_2240 [3];
  float local_2234 [3];
  undefined8 local_2228;
  ulong uStack_2220;
  undefined8 local_2218;
  ulong uStack_2210;
  undefined8 local_2208;
  ulong uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  float local_21e8;
  undefined4 local_21e4;
  float local_21d8;
  float local_21d4;
  float local_21d0;
  float local_21cc;
  float local_21c8;
  uint local_21c4;
  uint local_21c0;
  undefined4 local_219c;
  int *local_2198;
  undefined1 local_2188 [4];
  undefined1 local_2184 [4];
  undefined8 *local_2180;
  undefined8 *local_1ff0;
  float *local_1fe8;
  undefined8 *local_1fe0;
  float *local_1fd8;
  undefined8 *local_1fd0;
  undefined8 *local_1fc8;
  undefined8 *local_1fc0;
  undefined8 *local_1fb8;
  undefined8 *local_1fb0;
  float local_1f5c;
  float *local_1f58;
  float *local_1f50;
  float local_1f44;
  float local_1f40;
  float local_1f3c;
  float *local_1f38;
  float *local_1f30;
  float *local_1f28;
  float local_1f1c;
  float local_1f18;
  float local_1f14;
  float *local_1f10;
  float *local_1f08;
  float *local_1f00;
  float local_1ef4;
  float local_1ef0;
  float local_1eec;
  float *local_1ee8;
  undefined1 *local_1ee0;
  float *local_1ed8;
  float local_1ecc;
  float local_1ec8;
  float local_1ec4 [3];
  undefined1 *local_1eb8;
  float *local_1eb0;
  undefined8 *local_1ea8;
  undefined1 *local_1ea0;
  undefined8 *local_1e98;
  undefined4 *local_1e90;
  undefined8 *local_1e88;
  undefined4 *local_1e80;
  undefined8 *local_1e78;
  int *local_1e70;
  undefined4 *local_1d08;
  undefined4 *local_1d00;
  float *local_1cf8;
  undefined8 local_1cf0;
  uint local_1ce8;
  float local_1ce4;
  float local_1ce0;
  undefined4 local_1cdc;
  undefined4 local_1cd8;
  float *local_1cd0;
  undefined8 local_1cc8;
  undefined8 local_1cc0;
  undefined8 local_1cb8;
  undefined8 local_1cb0;
  undefined8 local_1ca8;
  undefined4 local_1ca0;
  undefined4 local_1c94;
  float *local_1c90;
  undefined4 local_1c84;
  undefined4 local_1c80;
  float local_1c7c;
  float local_1c78;
  uint local_1c74;
  undefined8 local_1c70;
  undefined8 local_1ab8;
  ulong uStack_1ab0;
  float local_1aa8;
  undefined4 local_1a9c;
  undefined8 local_1a98;
  ulong uStack_1a90;
  float local_1a88;
  float local_1a84;
  float local_1a80;
  undefined4 local_1a7c;
  undefined8 *local_1870;
  undefined8 *local_1868;
  float *local_1860;
  ulong local_a78;
  undefined8 uStack_a70;
  undefined1 local_a68 [16];
  ulong local_a58;
  undefined8 uStack_a50;
  float local_a3c;
  ulong local_a38;
  undefined8 uStack_a30;
  undefined1 local_818 [16];
  undefined4 local_7fc;
  undefined1 local_7f8 [16];
  undefined4 local_7dc;
  undefined1 local_7d8 [16];
  float local_7bc;
  ulong local_728;
  undefined8 uStack_720;
  ulong local_6a8;
  undefined8 uStack_6a0;
  ulong local_698;
  undefined8 uStack_690;
  float local_5e8;
  float local_548;
  float local_4a8;
  undefined8 local_488;
  undefined8 uStack_480;
  ulong local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  ulong local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ulong local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  undefined8 uStack_3f0;
  float local_368;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float *local_260;
  float *local_258;
  float *local_250;
  float *local_248;
  float *local_240;
  float *local_238;
  float *local_230;
  float *local_228;
  float *local_220;
  float *local_218;
  float *local_210;
  float *local_208;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  float *local_1e8;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float *local_1d0;
  float *local_1c8;
  float *local_1c0;
  float *local_1b8;
  float *local_1b0;
  float *local_1a8;
  float *local_1a0;
  float local_194;
  float local_190;
  float local_14c;
  float local_148;
  float local_104;
  float local_100;
  float *local_c0;
  float *local_70;
  float *local_68;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  
  local_1ff0 = &local_2208;
  local_1870 = &local_21f8;
  local_1860 = &local_21d8;
  local_1fe8 = in_RDX + 9;
  local_1fe0 = &local_2218;
  local_1a80 = in_RDX[0xb];
  local_1a88 = *local_1fe8;
  local_1a84 = in_RDX[10];
  local_1a98 = *(undefined8 *)local_1fe8;
  local_1a7c = 0;
  uStack_1a90 = (ulong)(uint)local_1a80;
  local_1f08 = local_2258;
  local_1eb8 = local_2184;
  local_1ec4[0] = in_XMM0_Da * *in_RDX;
  local_250 = local_1ec4;
  local_258 = &local_1ec8;
  local_260 = &local_1ecc;
  local_1ee8 = in_RDX + 3;
  local_1f10 = local_2264;
  local_1ee0 = local_2188;
  local_1eec = in_XMM1_Da * *local_1ee8;
  local_230 = &local_1eec;
  local_238 = &local_1ef0;
  local_240 = &local_1ef4;
  local_1f30 = local_224c;
  local_1f14 = local_1ec4[0] + local_1eec;
  local_210 = &local_1f14;
  local_218 = &local_1f18;
  local_220 = &local_1f1c;
  local_1f38 = in_RDX + 6;
  local_1f58 = local_2240;
  local_1f3c = local_1f14 + *local_1f38;
  local_1f0 = &local_1f3c;
  local_1f8 = &local_1f40;
  local_200 = &local_1f44;
  local_1fd8 = local_2234;
  local_54 = local_1f44 * local_1f44;
  local_60 = local_1f40 * local_1f40 + local_54;
  local_a3c = local_1f3c * local_1f3c + local_60;
  local_7d8._4_4_ = 0;
  local_7d8._0_4_ = local_a3c;
  local_a58 = local_7d8._0_8_;
  uStack_a50 = 0;
  local_728 = local_7d8._0_8_;
  uStack_720 = 0;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_7d8._0_8_;
  local_a68 = rsqrtss(auVar9,auVar9);
  local_7dc = 0x3fc00000;
  local_7f8 = ZEXT416(0x3fc00000);
  local_408 = local_a68._0_8_;
  uVar2 = local_408;
  uStack_400 = local_a68._8_8_;
  local_408._0_4_ = local_a68._0_4_;
  local_3f8 = (ulong)(uint)((float)local_408 * 1.5);
  uStack_3f0 = 0;
  local_7fc = 0xbf000000;
  local_818 = ZEXT416(0xbf000000);
  local_428 = local_818._0_8_;
  uStack_420 = 0;
  local_418 = (ulong)(uint)(local_a3c * -0.5);
  uStack_410 = 0;
  local_448 = local_a68._0_8_;
  uStack_440 = local_a68._8_8_;
  local_1f5c = local_a3c * -0.5 * (float)local_408;
  local_438 = (ulong)(uint)local_1f5c;
  uStack_430 = 0;
  local_468 = local_a68._0_8_;
  uStack_460 = local_a68._8_8_;
  local_458 = CONCAT44(local_a68._4_4_,(float)local_408 * (float)local_408);
  uStack_450 = local_a68._8_8_;
  local_488 = local_458;
  uStack_480 = local_a68._8_8_;
  local_1f5c = local_1f5c * (float)local_408 * (float)local_408;
  local_478 = (ulong)(uint)local_1f5c;
  uStack_470 = 0;
  local_6a8 = local_478;
  uStack_6a0 = 0;
  local_1f5c = (float)local_408 * 1.5 + local_1f5c;
  local_698 = (ulong)(uint)local_1f5c;
  uStack_690 = 0;
  local_a78 = local_698;
  uStack_a70 = 0;
  local_a38 = local_698;
  uStack_a30 = 0;
  local_1d0 = &local_1f5c;
  local_1aa8 = local_1f3c * local_1f5c;
  fVar6 = local_1f40 * local_1f5c;
  fVar7 = local_1f44 * local_1f5c;
  local_1a8 = &local_1d4;
  local_1b0 = &local_1d8;
  local_1b8 = &local_1dc;
  local_1fd0 = &local_2228;
  local_1ab8 = CONCAT44(local_1d8,local_1aa8);
  local_1a9c = 0;
  uStack_1ab0 = (ulong)(uint)local_1dc;
  local_1fc0 = &local_21f8;
  local_1fc8 = &local_2228;
  local_1ea8 = &local_2208;
  uStack_2200 = (ulong)(uint)local_1a80;
  local_1ea0 = &inf;
  local_219c = in_R8D;
  local_2198 = in_RCX;
  local_2180 = in_RSI;
  local_1fb8 = local_1fe0;
  local_1fb0 = local_1ff0;
  local_1f50 = local_1fd8;
  local_1f44 = local_1f1c + in_RDX[8];
  local_1f40 = local_1f18 + in_RDX[7];
  local_1f28 = local_1f58;
  local_1f1c = local_1ecc + local_1ef4;
  local_1f18 = local_1ec8 + local_1ef0;
  local_1f00 = local_1f30;
  local_1ef4 = in_XMM1_Da * in_RDX[5];
  local_1ef0 = in_XMM1_Da * in_RDX[4];
  local_1ed8 = local_1f10;
  local_1ecc = in_XMM0_Da * in_RDX[2];
  local_1ec8 = in_XMM0_Da * in_RDX[1];
  local_1eb0 = local_1f08;
  local_1868 = local_1ff0;
  local_7d8 = ZEXT416((uint)local_a3c);
  local_7bc = local_a3c;
  local_408 = uVar2;
  local_248 = local_1f08;
  local_228 = local_1f10;
  local_208 = local_1f30;
  local_1e8 = local_1f58;
  local_1dc = fVar7;
  local_1d8 = fVar6;
  local_1d4 = local_1aa8;
  local_1c8 = local_1f58;
  local_1c0 = local_1fd8;
  local_1a0 = local_1fd8;
  local_c0 = local_1f58;
  local_70 = local_1f58;
  local_68 = local_1f58;
  local_5c = local_1f3c;
  local_58 = local_1f3c;
  local_2264[0] = local_1eec;
  local_2258[0] = local_1ec4[0];
  local_224c[0] = local_1f14;
  local_2240[0] = local_1f3c;
  local_2234[0] = local_1aa8;
  local_2228 = local_1ab8;
  uStack_2220 = uStack_1ab0;
  local_2218 = local_1a98;
  uStack_2210 = uStack_1a90;
  local_2208 = local_1a98;
  local_21f8 = local_1ab8;
  uStack_21f0 = uStack_1ab0;
  local_21e8 = std::numeric_limits<float>::infinity();
  local_21c0 = 0xffffffff;
  local_21c4 = 0xffffffff;
  local_21e4 = 0xffffffff;
  local_1e98 = &local_2208;
  uStack_21f0 = CONCAT44(*(undefined4 *)((long)local_2180 + 0x1c),(undefined4)uStack_21f0);
  local_2270 = get_tsc();
  if (*(int *)(local_2180 + 4) == 2) {
    local_1e90 = &local_2290;
    local_2290 = 0;
    local_2288 = 0;
    local_2280 = 0;
    local_2278 = 0;
    local_228c = local_219c;
    local_1e88 = &local_2208;
    rtcTraversableOccluded1(local_2180[1],local_1e88,&local_2290);
    uVar8 = extraout_XMM1_Qa;
  }
  else {
    local_1e80 = &local_22b0;
    local_22b0 = 0;
    local_22a8 = 0;
    local_22a0 = 0;
    local_2298 = 0;
    local_22ac = local_219c;
    local_1e78 = &local_2208;
    rtcTraversableIntersect1(local_2180[1],local_1e78,&local_22b0);
    uVar8 = extraout_XMM1_Qa_00;
  }
  local_22b8 = get_tsc();
  local_1e70 = local_2198;
  *local_2198 = *local_2198 + 1;
  switch(*(undefined4 *)(local_2180 + 4)) {
  case 0:
    aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    *(undefined8 *)in_RDI = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    break;
  case 1:
    if (local_21c0 == 0xffffffff) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar8;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(auVar3 << 0x40);
      *(undefined8 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      local_298 = (float)local_21f8;
      fStack_294 = (float)((ulong)local_21f8 >> 0x20);
      fStack_290 = (float)uStack_21f0;
      if (0.0 <= local_298 * local_21d8 + fStack_294 * local_21d4 + fStack_290 * local_21d0) {
        fVar6 = local_21d8 * local_21d8 + local_21d4 * local_21d4 + local_21d0 * local_21d0;
        auVar9 = rsqrtss(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
        local_548 = auVar9._0_4_;
        uVar8 = CONCAT44(0,ABS(local_298 *
                               local_21d8 *
                               (local_548 * 1.5 + fVar6 * -0.5 * local_548 * local_548 * local_548)
                               + fStack_294 * local_148 + fStack_290 * local_14c));
        aVar10._8_8_ = 0;
        aVar10._0_8_ = uVar8;
        *(ulong *)in_RDI = uVar8;
        *(undefined8 *)(in_RDI + 8) = 0;
      }
      else {
        fVar6 = local_21d8 * local_21d8 + local_21d4 * local_21d4 + local_21d0 * local_21d0;
        auVar9 = rsqrtss(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
        local_4a8 = auVar9._0_4_;
        fVar6 = ABS(local_298 *
                    local_21d8 *
                    (local_4a8 * 1.5 + fVar6 * -0.5 * local_4a8 * local_4a8 * local_4a8) +
                    fStack_294 * local_190 + fStack_290 * local_194);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(ZEXT416((uint)fVar6) << 0x20);
        *(ulong *)in_RDI = (ulong)(uint)fVar6 << 0x20;
        *(undefined8 *)(in_RDI + 8) = 0;
      }
    }
    break;
  case 2:
    if (local_21e8 < 0.0) {
      aVar10._8_8_ = 0x3f800000;
      aVar10._0_8_ = 0x3f8000003f800000;
      *(undefined8 *)in_RDI = 0x3f8000003f800000;
      *(undefined8 *)(in_RDI + 8) = 0x3f800000;
    }
    else {
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
      *(undefined8 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    break;
  case 3:
    if (local_21c0 == 0xffffffff) {
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
      *(undefined8 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      fVar6 = (1.0 - local_21cc) - local_21c8;
      aVar10.m128[2] = fVar6;
      aVar10._0_8_ = CONCAT44(local_21c8,local_21cc);
      aVar10.m128[3] = 0.0;
      *(ulong *)in_RDI = CONCAT44(local_21c8,local_21cc);
      *(ulong *)(in_RDI + 8) = (ulong)(uint)fVar6;
    }
    break;
  case 4:
  case 5:
    if (local_21c0 == 0xffffffff) {
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(ZEXT816(0x3f800000) << 0x40);
      *(undefined8 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 8) = 0x3f800000;
    }
    else if (local_2180[2] == 0) {
      aVar10._8_8_ = uVar8;
      aVar10._0_8_ = 0x3f8000003f800000;
      *(undefined8 *)in_RDI = 0x3f8000003f800000;
      *(undefined8 *)(in_RDI + 8) = 0x3f8000003f800000;
    }
    else {
      local_2340 = 0;
      local_2344 = 0;
      local_1cf8 = &local_233c;
      local_1d00 = &local_2340;
      local_1d08 = &local_2344;
      local_233c = 0.0;
      local_2338 = 0.0;
      local_2348 = local_21c0;
      local_2350 = rtcGetGeometry(*local_2180,local_21c0);
      local_1cd0 = &local_233c;
      local_1c74 = local_21c4;
      local_1c78 = local_21cc;
      local_1c7c = local_21c8;
      local_1c80 = 2;
      local_1c84 = 2;
      local_1c94 = 2;
      local_1ce8 = local_21c4;
      local_1ce4 = local_21cc;
      local_1ce0 = local_21c8;
      local_1cdc = 2;
      local_1cd8 = 2;
      local_1cc8 = 0;
      local_1cc0 = 0;
      local_1cb8 = 0;
      local_1cb0 = 0;
      local_1ca8 = 0;
      local_1ca0 = 2;
      local_1cf0 = local_2350;
      local_1c90 = local_1cd0;
      local_1c70 = local_2350;
      rtcInterpolate(&local_1cf0);
      if (*(int *)(local_2180 + 4) == 4) {
        aVar10._8_8_ = 0;
        aVar10._0_8_ = CONCAT44(local_2338,local_233c);
        *(ulong *)in_RDI = CONCAT44(local_2338,local_233c);
        *(undefined8 *)(in_RDI + 8) = 0;
      }
      else {
        if (((int)(local_233c * 10.0) + (int)(local_2338 * 10.0)) % 2 == 0) {
          uVar8 = 0x3f800000;
          *(undefined8 *)in_RDI = 0x3f800000;
          *(undefined8 *)(in_RDI + 8) = 0;
        }
        else {
          uVar8 = 0x3f80000000000000;
          *(undefined8 *)in_RDI = 0x3f80000000000000;
          *(undefined8 *)(in_RDI + 8) = 0;
        }
        aVar10._8_8_ = 0;
        aVar10._0_8_ = uVar8;
      }
    }
    break;
  case 6:
    if (local_21c0 == 0xffffffff) {
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
      *(undefined8 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      fVar6 = local_21d8 * local_21d8 + local_21d4 * local_21d4 + local_21d0 * local_21d0;
      auVar9 = rsqrtss(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      local_368 = auVar9._0_4_;
      fVar6 = local_368 * 1.5 + fVar6 * -0.5 * local_368 * local_368 * local_368;
      uVar8 = CONCAT44(local_21d4 * fVar6,local_21d8 * fVar6) & 0x7fffffff7fffffff;
      aVar10._8_8_ = 0x7fffffff7fffffff;
      aVar10._0_8_ = uVar8;
      *(ulong *)in_RDI = uVar8;
      *(ulong *)(in_RDI + 8) = CONCAT44(fVar6 * 0.0,local_21d0 * fVar6) & 0x7fffffff7fffffff;
    }
    break;
  case 7:
    uVar8 = CONCAT44(0,(float)(local_22b8 - local_2270) * *(float *)(local_2180 + 3));
    aVar10._8_8_ = 0;
    aVar10._0_8_ = uVar8;
    *(ulong *)in_RDI = uVar8;
    *(undefined8 *)(in_RDI + 8) = 0;
    break;
  case 8:
    if (local_21c0 == 0xffffffff) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar8;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(auVar4 << 0x40);
      *(undefined8 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)randomColor(in_RDI,local_21c0);
    }
    break;
  case 9:
    if (local_21c0 == 0xffffffff) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar8;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(auVar5 << 0x40);
      *(undefined8 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      randomColor((embree *)local_2388,local_21c0 ^ local_21c4);
      fVar6 = local_21d8 * local_21d8 + local_21d4 * local_21d4 + local_21d0 * local_21d0;
      auVar9 = rsqrtss(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      local_5e8 = auVar9._0_4_;
      local_2f8 = (float)local_21f8;
      fStack_2f4 = (float)((ulong)local_21f8 >> 0x20);
      fStack_2f0 = (float)uStack_21f0;
      fVar6 = local_2f8 *
              local_21d8 * (local_5e8 * 1.5 + fVar6 * -0.5 * local_5e8 * local_5e8 * local_5e8) +
              fStack_2f4 * local_100 + fStack_2f0 * local_104;
      uVar8 = CONCAT44(fVar6,fVar6) & 0x7fffffff7fffffff;
      uVar1 = CONCAT44(fVar6,fVar6) & 0x7fffffff7fffffff;
      local_318 = (float)local_2388[0];
      fStack_314 = (float)((ulong)local_2388[0] >> 0x20);
      fStack_310 = (float)local_2388[1];
      fStack_30c = (float)((ulong)local_2388[1] >> 0x20);
      local_328 = (float)uVar8;
      fStack_324 = (float)(uVar8 >> 0x20);
      fStack_320 = (float)uVar1;
      fStack_31c = (float)(uVar1 >> 0x20);
      uVar2 = CONCAT44(fStack_314 * fStack_324,local_318 * local_328);
      aVar10._8_8_ = local_2388[0];
      aVar10._0_8_ = uVar2;
      *(undefined8 *)in_RDI = uVar2;
      *(ulong *)(in_RDI + 8) = CONCAT44(fStack_30c * fStack_31c,fStack_310 * fStack_320);
    }
    break;
  case 10:
    aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    *(undefined8 *)in_RDI = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    break;
  default:
    aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    *(undefined8 *)in_RDI = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  return (Vec3fa)aVar10;
}

Assistant:

Vec3fa renderPixelDebugShader(const DebugShaderData& data, float x, float y, const ISPCCamera& camera, RayStats& stats, const RTCFeatureFlags feature_mask)
{
  /* initialize ray */
  Ray ray;
  ray.org = Vec3ff(camera.xfm.p);
  ray.dir = Vec3ff(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz));
  ray.tnear() = 0.0f;
  ray.tfar = inf;
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;
  ray.time() = data.debug;

  /* intersect ray with scene */
  int64_t c0 = get_tsc();
  if (data.shader == SHADER_OCCLUSION)
  {
    RTCOccludedArguments args;
    rtcInitOccludedArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableOccluded1(data.traversable,RTCRay_(ray),&args);
  }
  else
  {
    RTCIntersectArguments args;
    rtcInitIntersectArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  }

  int64_t c1 = get_tsc();
  RayStats_addRay(stats);

  /* shade pixel */
  switch (data.shader)
  {
  case SHADER_EYELIGHT:
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return Vec3fa(0.0f);
    else if (dot(ray.dir,ray.Ng) < 0.0f)
      return Vec3fa(0.0f,abs(dot(ray.dir,normalize(ray.Ng))),0.0f);
    else
      return Vec3fa(abs(dot(ray.dir,normalize(ray.Ng))),0.0f,0.0f);

  case SHADER_OCCLUSION:
    if (ray.tfar >= 0.0f) 
      return Vec3fa(0.0f,0.0f,0.0f);
    else 
      return Vec3fa(1.0f,1.0f,1.0f);

  case SHADER_UV:
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f,0.0f,0.0f);
    else return Vec3fa(ray.u,ray.v,1.0f-ray.u-ray.v);

  case SHADER_TEXCOORDS:
  case SHADER_TEXCOORDS_GRID:

#if !defined(__SYCL_DEVICE_ONLY__)
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return Vec3fa(0.0f,0.0f,1.0f);

    else if (data.ispc_scene)
    {
      Vec2f st = Vec2f(0,0);
      auto geomID = ray.geomID; {
        RTCGeometry geometry = rtcGetGeometry(data.scene,geomID);
        rtcInterpolate0(geometry,ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE,2,&st.x,2);
      }
      if (data.shader == SHADER_TEXCOORDS)
        return Vec3fa(st.x,st.y,0.0f);
      else
        return ((int)(10.0f*st.x)+(int)(10.0f*st.y)) % 2 == 0 ? Vec3fa(1,0,0) : Vec3fa(0,1,0);
    }
#endif
    
    return Vec3fa(1.0f);

  case SHADER_NG:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f,0.0f,0.0f);
    else return abs(normalize(Vec3fa(ray.Ng.x,ray.Ng.y,ray.Ng.z)));
    //else return normalize(Vec3fa(ray.Ng.x,ray.Ng.y,ray.Ng.z));

  case SHADER_GEOMID:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);
    else return randomColor(ray.geomID);
    
  case SHADER_GEOMID_PRIMID:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);
    else return randomColor(ray.geomID ^ ray.primID)*Vec3fa(abs(dot(ray.dir,normalize(ray.Ng))));
    
  case SHADER_CYCLES:
    return Vec3fa((float)(c1-c0)*data.scale,0.0f,0.0f);
    
  case SHADER_AO:
    return Vec3fa(0,0,0);

  case SHADER_DEFAULT:
    return Vec3fa(0,0,0);
  }
  
  return Vec3fa(0,0,0);
}